

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O2

bool __thiscall
QWidgetTextControl::setFocusToNextOrPreviousAnchor(QWidgetTextControl *this,bool next)

{
  QTextCursor *startCursor;
  long lVar1;
  qreal qVar2;
  MoveMode MVar3;
  char cVar4;
  bool bVar5;
  long in_FS_OFFSET;
  QRectF local_80;
  QTextCursor newAnchor;
  QRectF local_58;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  if ((*(byte *)(lVar1 + 0xb0) & 8) == 0) {
    cVar4 = '\0';
  }
  else {
    local_58.w = -NAN;
    local_58.h = -NAN;
    local_58.xp = -NAN;
    local_58.yp = -NAN;
    selectionRect(&local_58,this);
    updateRequest(this,&local_58);
    startCursor = (QTextCursor *)(lVar1 + 0x88);
    cVar4 = QTextCursor::hasSelection();
    if (cVar4 == '\0') {
      QTextCursor::QTextCursor((QTextCursor *)&local_80,*(QTextDocument **)(lVar1 + 0x78));
      qVar2 = *(qreal *)(lVar1 + 0x88);
      *(qreal *)(lVar1 + 0x88) = local_80.xp;
      local_80.xp = qVar2;
      QTextCursor::~QTextCursor((QTextCursor *)&local_80);
      MVar3 = 0xb;
      if (next) {
        MVar3 = KeepAnchor;
      }
      QTextCursor::movePosition((MoveOperation)startCursor,MVar3,0);
    }
    _newAnchor = &DAT_aaaaaaaaaaaaaaaa;
    QTextCursor::QTextCursor(&newAnchor);
    bVar5 = findNextPrevAnchor(this,startCursor,next,&newAnchor);
    if (bVar5) {
      QTextCursor::operator=(startCursor,&newAnchor);
      *(undefined1 *)(lVar1 + 0x90) = 1;
    }
    else {
      QTextCursor::clearSelection();
    }
    cVar4 = QTextCursor::hasSelection();
    if (cVar4 != '\0') {
      selectionRect(&local_80,this);
      local_58.w = local_80.w;
      local_58.h = local_80.h;
      local_58.xp = local_80.xp;
      local_58.yp = local_80.yp;
      updateRequest(this,&local_58);
      visibilityRequest(this,&local_58);
    }
    QTextCursor::~QTextCursor(&newAnchor);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (bool)cVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QWidgetTextControl::setFocusToNextOrPreviousAnchor(bool next)
{
    Q_D(QWidgetTextControl);

    if (!(d->interactionFlags & Qt::LinksAccessibleByKeyboard))
        return false;

    QRectF crect = selectionRect();
    emit updateRequest(crect);

    // If we don't have a current anchor, we start from the start/end
    if (!d->cursor.hasSelection()) {
        d->cursor = QTextCursor(d->doc);
        if (next)
            d->cursor.movePosition(QTextCursor::Start);
        else
            d->cursor.movePosition(QTextCursor::End);
    }

    QTextCursor newAnchor;
    if (findNextPrevAnchor(d->cursor, next, newAnchor)) {
        d->cursor = newAnchor;
        d->cursorIsFocusIndicator = true;
    } else {
        d->cursor.clearSelection();
    }

    if (d->cursor.hasSelection()) {
        crect = selectionRect();
        emit updateRequest(crect);
        emit visibilityRequest(crect);
        return true;
    } else {
        return false;
    }
}